

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

void __thiscall DFraggleThinker::Tick(DFraggleThinker *this)

{
  DRunningScript *script;
  bool bVar1;
  DObject *pDVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1 pointed;
  DObject *pDVar3;
  DFsScript *this_00;
  long lVar4;
  DRunningScript *pDVar5;
  
  pDVar2 = (this->RunningScripts).field_0.o;
  if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
    (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
    pDVar2 = (DObject *)0x0;
  }
  pDVar5 = (DRunningScript *)pDVar2[5]._vptr_DObject;
  if ((pDVar5 != (DRunningScript *)0x0) && (((pDVar5->super_DObject).ObjectFlags & 0x20) != 0)) {
    pDVar2[5]._vptr_DObject = (_func_int **)0x0;
    pDVar5 = (DRunningScript *)0x0;
  }
  while (script = pDVar5, script != (DRunningScript *)0x0) {
    bVar1 = wait_finished(this,script);
    if (bVar1) {
      lVar4 = 8;
      do {
        ((script->script).field_0.p)->sections[lVar4 + 9].field_0 =
             *(anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 *)(script->variables + lVar4 + -8);
        pDVar2 = (script->script).field_0.o;
        if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
          (script->script).field_0.p = (DFsScript *)0x0;
          pDVar2 = (DObject *)0x0;
        }
        pointed = (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)
                  script->variables[lVar4 + -8].field_0.o;
        if ((pointed != (DFsVariable *)0x0) &&
           ((((pointed.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
          script->variables[lVar4 + -8].field_0 =
               (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
          pointed.p = (DFsVariable *)0x0;
        }
        if (((pointed.p != (DFsVariable *)0x0) &&
            ((((pointed.p)->super_DObject).ObjectFlags & 3) != 0)) &&
           ((pDVar2->ObjectFlags & 4) != 0)) {
          GC::Barrier(pDVar2,pointed.o);
        }
        script->variables[lVar4 + -8].field_0 =
             (anon_union_8_2_947301c2_for_TObjPtr<DFsVariable>_1)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x18);
      (((script->script).field_0.p)->trigger).field_0 = (script->trigger).field_0;
      (((script->prev).field_0.p)->next).field_0 = (script->next).field_0;
      pDVar2 = (script->prev).field_0.o;
      if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
        (script->prev).field_0.p = (DRunningScript *)0x0;
        pDVar2 = (DObject *)0x0;
      }
      pDVar3 = (script->next).field_0.o;
      if ((pDVar3 != (DObject *)0x0) && ((pDVar3->ObjectFlags & 0x20) != 0)) {
        (script->next).field_0.p = (DRunningScript *)0x0;
        pDVar3 = (DObject *)0x0;
      }
      if (((pDVar3 != (DObject *)0x0) && ((pDVar3->ObjectFlags & 3) != 0)) &&
         ((pDVar2->ObjectFlags & 4) != 0)) {
        GC::Barrier(pDVar2,pDVar3);
      }
      pDVar5 = (script->next).field_0.p;
      if (pDVar5 != (DRunningScript *)0x0) {
        if (((pDVar5->super_DObject).ObjectFlags & 0x20) == 0) {
          (((script->next).field_0.p)->prev).field_0 = (script->prev).field_0;
          pDVar2 = (script->next).field_0.o;
          if ((pDVar2 != (DObject *)0x0) && ((pDVar2->ObjectFlags & 0x20) != 0)) {
            (script->next).field_0.p = (DRunningScript *)0x0;
            pDVar2 = (DObject *)0x0;
          }
          pDVar3 = (script->prev).field_0.o;
          if ((pDVar3 != (DObject *)0x0) && ((pDVar3->ObjectFlags & 0x20) != 0)) {
            (script->prev).field_0.p = (DRunningScript *)0x0;
            pDVar3 = (DObject *)0x0;
          }
          if (((pDVar3 != (DObject *)0x0) && ((pDVar3->ObjectFlags & 3) != 0)) &&
             ((pDVar2->ObjectFlags & 4) != 0)) {
            GC::Barrier(pDVar2,pDVar3);
          }
        }
        else {
          (script->next).field_0.p = (DRunningScript *)0x0;
        }
      }
      pDVar5 = (script->next).field_0.p;
      if ((pDVar5 != (DRunningScript *)0x0) && (((pDVar5->super_DObject).ObjectFlags & 0x20) != 0))
      {
        (script->next).field_0.p = (DRunningScript *)0x0;
        pDVar5 = (DRunningScript *)0x0;
      }
      this_00 = (script->script).field_0.p;
      if ((this_00 != (DFsScript *)0x0) && (((this_00->super_DObject).ObjectFlags & 0x20) != 0)) {
        (script->script).field_0.p = (DFsScript *)0x0;
        this_00 = (DFsScript *)0x0;
      }
      DFsScript::ParseScript(this_00,((script->script).field_0.p)->data + script->save_point);
      (*(script->super_DObject)._vptr_DObject[4])(script);
    }
    else {
      pDVar5 = (script->next).field_0.p;
      if ((pDVar5 != (DRunningScript *)0x0) && (((pDVar5->super_DObject).ObjectFlags & 0x20) != 0))
      {
        (script->next).field_0.p = (DRunningScript *)0x0;
        pDVar5 = (DRunningScript *)0x0;
      }
    }
  }
  return;
}

Assistant:

void DFraggleThinker::Tick()
{
	DRunningScript *current, *next;
	int i;
	
	current = RunningScripts->next;
    
	while(current)
	{
		if(wait_finished(current))
		{
			// copy out the script variables from the
			// runningscript
			
			for(i=0; i<VARIABLESLOTS; i++)
			{
				current->script->variables[i] = current->variables[i];
				GC::WriteBarrier(current->script, current->variables[i]);
				current->variables[i] = NULL;
			}
			current->script->trigger = current->trigger; // copy trigger
			
			// unhook from chain 
			current->prev->next = current->next;
			GC::WriteBarrier(current->prev, current->next);
			if(current->next) 
			{
				current->next->prev = current->prev;
				GC::WriteBarrier(current->next, current->prev);
			}
			next = current->next;   // save before freeing
			
			// continue the script
			current->script->ParseScript (current->script->data + current->save_point);

			// free
			current->Destroy();
		}
		else
			next = current->next;
		current = next;   // continue to next in chain
	}
}